

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstack.cc
# Opt level: O1

int main(int argc,char **argv)

{
  _Any_data *p_Var1;
  _func_void **__return_storage_ptr__;
  undefined8 proc;
  int iVar2;
  uint uVar3;
  __pid_t _Var4;
  __pid_t _Var5;
  undefined8 uVar6;
  Flags *pFVar7;
  void *pvVar8;
  long lVar9;
  ostream *poVar10;
  int *piVar11;
  char *pcVar12;
  size_t sVar13;
  FILE *__stream;
  uint uVar14;
  undefined8 this;
  size_type __n;
  ulonglong uVar15;
  ulong uVar16;
  __ptrace_request __request;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulonglong uVar17;
  pointer __pos;
  ulonglong uVar18;
  ulong uVar19;
  double dVar20;
  undefined1 auStack_26e8 [8];
  char line [4096];
  undefined1 local_16e0 [8];
  sigaction sa;
  char statusBuf [4096];
  ofstream out;
  ios_base local_550 [264];
  undefined1 auStack_448 [8];
  Flags flags;
  Context context;
  ostream *local_360;
  undefined4 local_350;
  undefined1 local_34c;
  undefined1 local_34b [3];
  undefined1 local_348 [4];
  undefined1 local_344 [12];
  int local_338;
  Context *local_318;
  undefined8 uStack_310;
  code *local_308;
  code *pcStack_300;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  code *pcStack_2e0;
  Context *local_2d8;
  int *piStack_2d0;
  code *local_2c8;
  code *pcStack_2c0;
  Context *local_2b8;
  int *piStack_2b0;
  code *local_2a8;
  code *pcStack_2a0;
  undefined1 *local_298;
  undefined8 uStack_290;
  code *local_288;
  code *pcStack_280;
  undefined1 *local_278;
  undefined8 uStack_270;
  code *local_268;
  code *pcStack_260;
  undefined8 *local_258;
  undefined8 uStack_250;
  code *local_248;
  code *pcStack_240;
  double *local_238;
  undefined8 uStack_230;
  code *local_228;
  code *pcStack_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  int *local_1d8;
  char *pcStack_1d0;
  code *local_1c8;
  code *pcStack_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *pcStack_1a0;
  long *local_198;
  undefined8 uStack_190;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  undefined1 local_158 [8];
  string execName;
  int status;
  undefined1 auStack_118 [8];
  pid_t pid;
  _Manager_type local_108;
  code *pcStack_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  double sleepTime;
  string subprocessCmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  undefined1 local_88 [16];
  _Manager_type local_78;
  code *pcStack_70;
  int local_60;
  uint local_5c;
  int exitCode;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined1 local_41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  bool printAllStacks;
  uint local_38;
  
  piVar11 = &flags.longVal;
  pstack::Context::Context((Context *)piVar11);
  memset((sigaction *)local_16e0,0,0x98);
  local_16e0 = (undefined1  [8])main::anon_class_1_0_00000001::__invoke;
  sa.sa_mask.__val[0xf]._0_4_ = 0x80000000;
  sigaction(2,(sigaction *)local_16e0,(sigaction *)0x0);
  local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _exitCode = argv;
  std::ofstream::ofstream(statusBuf + 0xff8);
  local_158 = (undefined1  [8])&execName._M_string_length;
  execName._M_dataplus._M_p = (pointer)0x0;
  execName._M_string_length._0_1_ = 0;
  local_41 = 0;
  local_60 = -1;
  sleepTime = (double)&subprocessCmd._M_string_length;
  subprocessCmd._M_dataplus._M_p = (pointer)0x0;
  subprocessCmd._M_string_length._0_1_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flags.data;
  flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_448 = (undefined1  [8])0x0;
  flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flags.data._M_t._M_impl._0_4_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&flags.shortOptions._M_string_length;
  flags.shortOptions._M_dataplus._M_p = (pointer)0x0;
  flags.shortOptions._M_string_length._0_1_ = 0;
  flags.shortOptions.field_2._8_4_ = 0xfffffffe;
  local_188 = (code *)0x0;
  pcStack_180 = (code *)0x0;
  local_198 = (long *)0x0;
  uStack_190 = 0;
  flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       flags.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_198 = (long *)operator_new(0x18);
  *local_198 = (long)&exitCode;
  local_198[1] = (long)auStack_448;
  local_198[2] = (long)piVar11;
  pcStack_180 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:231:13)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:231:13)>
              ::_M_manager;
  uVar6 = pstack::Flags::add(auStack_448,"replace-path",0x46,"from:to",
                             "replace `from` with `to` in paths when finding shared libraries");
  uStack_310 = 0;
  pcStack_300 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:242:13)>
                ::_M_invoke;
  local_308 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:242:13)>
              ::_M_manager;
  local_318 = (Context *)piVar11;
  uVar6 = pstack::Flags::add(uVar6,"debug-dir",0x67,"directory",
                             "extra location to find debug files for binaries and shared libraries")
  ;
  uStack_2f0 = 0;
  local_2f8 = &local_f0;
  pcStack_2e0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
                ::_M_invoke;
  local_2e8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  uVar6 = pstack::Flags::add(uVar6,"constant",0x62,"delay",
                             "repeat pstack, with `delay` seconds between each iteration (can be non-integer)"
                            );
  pcStack_2c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:254:13)>
                ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:254:13)>
              ::_M_manager;
  local_2d8 = (Context *)piVar11;
  piStack_2d0 = &local_60;
  uVar6 = pstack::Flags::add(uVar6,"elf-dump",100,"ELF file",
                             "dump details of an ELF image in JSON and exit");
  pcStack_2a0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:262:13)>
                ::_M_invoke;
  local_2a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:262:13)>
              ::_M_manager;
  local_2b8 = (Context *)piVar11;
  piStack_2b0 = &local_60;
  local_5c = argc;
  uVar6 = pstack::Flags::add(uVar6,"dwarf-dump",0x44,"ELF file",
                             "dump details of DWARF information in an ELF image in JSON and exit");
  local_298 = local_348;
  uStack_290 = 0;
  pcStack_280 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
                ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  uVar6 = pstack::Flags::add(uVar6,"depth",0x72,"depth","max depth when printing python structures")
  ;
  local_278 = local_344;
  uStack_270 = 0;
  pcStack_260 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  pFVar7 = (Flags *)pstack::Flags::add(uVar6,"max-frames",0x4d,"max frames",
                                       "maximum number of stack frames to print for a thread");
  statusBuf[8] = '\0';
  statusBuf[9] = '\0';
  statusBuf[10] = '\0';
  statusBuf[0xb] = '\0';
  statusBuf[0xc] = '\0';
  statusBuf[0xd] = '\0';
  statusBuf[0xe] = '\0';
  statusBuf[0xf] = '\0';
  statusBuf[0x10] = '\0';
  statusBuf[0x11] = '\0';
  statusBuf[0x12] = '\0';
  statusBuf[0x13] = '\0';
  statusBuf[0x14] = '\0';
  statusBuf[0x15] = '\0';
  statusBuf[0x16] = '\0';
  statusBuf[0x17] = '\0';
  sa.sa_restorer = (_func_void *)0x0;
  statusBuf[0] = '\0';
  statusBuf[1] = '\0';
  statusBuf[2] = '\0';
  statusBuf[3] = '\0';
  statusBuf[4] = '\0';
  statusBuf[5] = '\0';
  statusBuf[6] = '\0';
  statusBuf[7] = '\0';
  sa.sa_restorer = (_func_void *)operator_new(0x18);
  uVar3 = local_5c;
  *(int **)sa.sa_restorer = &local_60;
  *(int **)(sa.sa_restorer + 8) = &exitCode;
  *(undefined1 **)(sa.sa_restorer + 0x10) = auStack_448;
  statusBuf._16_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:283:13)>
       ::_M_invoke;
  statusBuf._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:283:13)>
       ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"help",0x68,"generate this help message",(VCb *)&sa.sa_restorer
                             );
  auStack_26e8 = (undefined1  [8])((long)&local_350 + 1);
  line[0] = '\x01';
  line[1] = '\0';
  line[2] = '\0';
  line[3] = '\0';
  line[4] = '\0';
  line[5] = '\0';
  line[6] = '\0';
  line[7] = '\0';
  line._16_8_ = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  line._8_8_ = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
               ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"args",0x61,
                              "attempt to show the value of arguments to functions",
                              (VCb *)auStack_26e8);
  subprocessCmd.field_2._8_8_ = &(anonymous_namespace)::doJson;
  pFVar7 = pstack::Flags::add(pFVar7,"json",0x6a,"use JSON output rather than plaintext",
                              (VCb *)((long)&subprocessCmd.field_2 + 8));
  local_88._0_8_ = &local_350;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  pcStack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
             ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"no-src",0x73,"don\'t include source info",(VCb *)local_88);
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a8._M_unused._M_object = &flags.longVal;
  pcStack_90 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:303:13)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:303:13)>
             ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"verbose",0x76,"more debugging data. Can be repeated",
                              (VCb *)&local_a8);
  execName.field_2._8_8_ = (long)&local_350 + 3;
  pFVar7 = pstack::Flags::add(pFVar7,"no-threaddb",0x74,
                              "don\'t use the thread_db functions to enumerate pthreads (just uses LWPs)"
                              ,(VCb *)((long)&execName.field_2 + 8));
  auStack_118 = (undefined1  [8])&local_41;
  _pid = 1;
  pcStack_100 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"all",0x41,
                              "show both python and DWARF (C/C++/go/rust) stack traces",
                              (VCb *)auStack_118);
  local_1b8._M_unused._M_object = local_34b;
  local_1b8._8_8_ = 1;
  pcStack_1a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"no-ext-debug",0x6e,
                              "don\'t load external debugging information when processing",
                              (VCb *)&local_1b8);
  local_178._8_8_ = 0;
  pcStack_160 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:323:13)>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:323:13)>
              ::_M_manager;
  local_178._M_unused._M_object = &local_60;
  pFVar7 = pstack::Flags::add(pFVar7,"version",0x56,"dump version and exit",(VCb *)&local_178);
  uStack_250 = 0;
  local_258 = (undefined8 *)local_158;
  pcStack_240 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:346:43)>
                ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:346:43)>
              ::_M_manager;
  uVar6 = pstack::Flags::add(pFVar7,"executable",0x65,"executable","executable to use by default");
  uStack_230 = 0;
  local_238 = &sleepTime;
  pcStack_220 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:95:26)>
              ::_M_manager;
  pFVar7 = (Flags *)pstack::Flags::add(uVar6,"command",0x78,"command line",
                                       "execute command line as subprocess, trace when it receives a signal"
                                      );
  local_218._M_unused._M_object = &local_34c;
  local_218._8_8_ = 1;
  pcStack_200 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"no-die-names",0x59,"do not use DIE names for functions",
                              (VCb *)&local_218);
  local_1f8._M_unused._M_object = &(anonymous_namespace)::freeres;
  local_1f8._8_8_ = 1;
  pcStack_1e0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
              ::_M_manager;
  pFVar7 = pstack::Flags::add(pFVar7,"freeres",0,
                              "free all memory at exit (useful for valgrind/heapcheck)",
                              (VCb *)&local_1f8);
  local_1d8 = &flags.longVal;
  pcStack_1d0 = statusBuf + 0xff8;
  pcStack_1c0 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:359:62)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc:359:62)>
              ::_M_manager;
  iVar2 = pstack::Flags::add(pFVar7,"output",0x6f,"output file",
                             "write output to <output file> instead of stdout");
  pstack::Flags::parse(iVar2,(char **)(ulong)uVar3);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,__destroy_functor);
  }
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,3);
  }
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,3);
  }
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if (local_108 != (_Manager_type)0x0) {
    (*local_108)((_Any_data *)auStack_118,(_Any_data *)auStack_118,__destroy_functor);
  }
  p_Var1 = (_Any_data *)((long)&execName.field_2 + 8);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
  ::_M_manager(p_Var1,p_Var1,__destroy_functor);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  p_Var1 = (_Any_data *)((long)&subprocessCmd.field_2 + 8);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/flags.h:90:38)>
  ::_M_manager(p_Var1,p_Var1,__destroy_functor);
  if (line._8_8_ != 0) {
    (*(code *)line._8_8_)(auStack_26e8,auStack_26e8,3);
  }
  if (statusBuf._8_8_ != 0) {
    (*(code *)statusBuf._8_8_)(&sa.sa_restorer,&sa.sa_restorer,3);
  }
  if (local_268 != (code *)0x0) {
    (*local_268)(&local_278,&local_278,3);
  }
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,3);
  }
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)(&local_2b8,&local_2b8,3);
  }
  if (local_2c8 != (code *)0x0) {
    (*local_2c8)(&local_2d8,&local_2d8,3);
  }
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,3);
  }
  if (local_308 != (code *)0x0) {
    (*local_308)(&local_318,&local_318,3);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  iVar2 = local_60;
  if (local_60 == -1) {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_158,"");
    if (iVar2 == 0) {
      this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar6 = (int *)0x0;
    }
    else {
      pstack::Context::getImageForName((string *)&sa.sa_restorer,(bool)((char)&flags + 'h'));
      this = statusBuf._0_8_;
      uVar6 = sa.sa_restorer;
      sa.sa_restorer = (_func_void *)0x0;
      statusBuf[0] = '\0';
      statusBuf[1] = '\0';
      statusBuf[2] = '\0';
      statusBuf[3] = '\0';
      statusBuf[4] = '\0';
      statusBuf[5] = '\0';
      statusBuf[6] = '\0';
      statusBuf[7] = '\0';
    }
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &sleepTime,"");
    if (iVar2 == 0) {
      lVar9 = (long)(int)_optind;
      if (_optind == uVar3) {
        iVar2 = 0x40;
        anon_unknown.dwarf_1567e::usage((ostream *)&std::cerr,*_exitCode,(Flags *)auStack_448);
      }
      else {
        iVar2 = 0;
        if ((int)_optind < (int)uVar3) {
          local_50 = local_f0;
          dVar20 = (double)local_f0 * 1000000.0;
          local_38 = 0;
          p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
          do {
            local_88._8_8_ = p_Stack_40;
            if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Stack_40->_M_use_count = p_Stack_40->_M_use_count + 1;
              }
            }
            local_88._0_8_ = uVar6;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&sa.sa_restorer,_exitCode[lVar9],(allocator<char> *)auStack_26e8);
            pstack::Procman::Process::load
                      ((undefined1 *)((long)&subprocessCmd.field_2 + 8),&flags.longVal,local_88,
                       &sa.sa_restorer);
            if (sa.sa_restorer != (_func_void *)(statusBuf + 8)) {
              operator_delete(sa.sa_restorer,statusBuf._8_8_ + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
            }
            proc = subprocessCmd.field_2._8_8_;
            if (subprocessCmd.field_2._8_8_ == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)auStack_26e8,_exitCode[lVar9],
                         (allocator<char> *)(execName.field_2._M_local_buf + 8));
              pstack::Context::getImageForName
                        ((string *)local_a8._M_pod_data,(bool)((char)&flags + 'h'));
              this = local_a8._8_8_;
              uVar6 = local_a8._M_unused._0_8_;
              local_a8._M_unused._M_object = (int *)0x0;
              local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
              }
              if (auStack_26e8 != (undefined1  [8])(line + 8)) {
                operator_delete((void *)auStack_26e8,line._8_8_ + 1);
              }
            }
            else {
              while (this = p_Stack_40, (anonymous_namespace)::interrupted == '\0') {
                anon_unknown.dwarf_1567e::pstack((Process *)proc);
                if (((double)local_50 == 0.0) && (this = p_Stack_40, !NAN((double)local_50))) break;
                usleep((__useconds_t)(long)dVar20);
              }
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1);
            lVar9 = lVar9 + 1;
            p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
          } while ((uint)lVar9 != local_5c);
          iVar2 = 0x46;
          if ((local_38 & 1) == 0) {
            iVar2 = 0;
          }
        }
      }
    }
    else {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this)->_M_use_count + 1;
        }
      }
      subprocessCmd.field_2._8_8_ = 0;
      __pos = (pointer)0x0;
      __return_storage_ptr__ = &sa.sa_restorer;
      local_a8._M_unused._0_8_ = (undefined8)uVar6;
      local_a8._8_8_ = this;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      do {
        dVar20 = sleepTime;
        __n = 0xffffffffffffffff;
        if (__pos <= subprocessCmd._M_dataplus._M_p &&
            (long)subprocessCmd._M_dataplus._M_p - (long)__pos != 0) {
          pvVar8 = memchr(__pos + (long)sleepTime,0x20,
                          (long)subprocessCmd._M_dataplus._M_p - (long)__pos);
          __n = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)dVar20;
        }
        if (__n == 0xffffffffffffffff) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sleepTime
                     ,(size_type)__pos,0xffffffffffffffff);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (subprocessCmd.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__);
          if (sa.sa_restorer != (_func_void *)(statusBuf + 8)) {
            operator_delete(sa.sa_restorer,statusBuf._8_8_ + 1);
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sleepTime
                     ,(size_type)__pos,__n);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     (subprocessCmd.field_2._M_local_buf + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__);
          if (sa.sa_restorer != (_func_void *)(statusBuf + 8)) {
            operator_delete(sa.sa_restorer,statusBuf._8_8_ + 1);
          }
          __pos = (pointer)(__n + 1);
        }
      } while (__n != 0xffffffffffffffff);
      uVar3 = fork();
      this = p_Stack_40;
      auStack_118._0_4_ = uVar3;
      if (uVar3 != 0xffffffff) {
        if (uVar3 == 0) {
          lVar9 = ptrace(PTRACE_TRACEME,0,0,0);
          if ((int)lVar9 != 0) {
            __assert_fail("rc == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                          ,0x4b,
                          "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                         );
          }
          sa.sa_restorer = (_func_void *)0x0;
          statusBuf[0] = '\0';
          statusBuf[1] = '\0';
          statusBuf[2] = '\0';
          statusBuf[3] = '\0';
          statusBuf[4] = '\0';
          statusBuf[5] = '\0';
          statusBuf[6] = '\0';
          statusBuf[7] = '\0';
          statusBuf[8] = '\0';
          statusBuf[9] = '\0';
          statusBuf[10] = '\0';
          statusBuf[0xb] = '\0';
          statusBuf[0xc] = '\0';
          statusBuf[0xd] = '\0';
          statusBuf[0xe] = '\0';
          statusBuf[0xf] = '\0';
          if (subprocessCmd.field_2._8_8_ != 0) {
            uVar6 = subprocessCmd.field_2._8_8_;
            do {
              auStack_26e8 = *(undefined1 (*) [8])uVar6;
              std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                        ((vector<char_const*,std::allocator<char_const*>> *)&sa.sa_restorer,
                         (char **)auStack_26e8);
              uVar6 = uVar6 + 0x20;
            } while ((undefined8 *)uVar6 != (undefined8 *)0x0);
          }
          auStack_26e8 = (undefined1  [8])0x0;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&sa.sa_restorer,
                     (char **)auStack_26e8);
          execvp(*(char **)sa.sa_restorer,(char **)sa.sa_restorer);
          if (2 < local_338) {
            _Var4 = getpid();
            poVar10 = (ostream *)std::ostream::operator<<(local_360,_Var4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," execvp failed: ",0x10);
            piVar11 = __errno_location();
            pcVar12 = strerror(*piVar11);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
            }
            else {
              sVar13 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          }
          if (sa.sa_restorer != (_func_void *)0x0) {
            operator_delete(sa.sa_restorer,statusBuf._8_8_ - (long)sa.sa_restorer);
          }
        }
        else {
          snprintf((char *)&sa.sa_restorer,0x1000,"/proc/%d/status",(ulong)uVar3);
          __stream = fopen64((char *)&sa.sa_restorer,"r");
          if (__stream == (FILE *)0x0) {
            __assert_fail("statusFile.get()",
                          "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                          ,0x5f,
                          "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                         );
          }
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          while( true ) {
            if (2 < local_338) {
              _Var4 = getpid();
              poVar10 = (ostream *)std::ostream::operator<<(local_360,_Var4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," waiting...\n",0xc);
            }
            _Var4 = wait((void *)((long)&execName.field_2 + 8));
            if (_Var4 != auStack_118._0_4_) break;
            if (2 < local_338) {
              _Var5 = getpid();
              poVar10 = (ostream *)std::ostream::operator<<(local_360,_Var5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"... done - rc=",0xe);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,_Var4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,", status=",9);
              poVar10 = (ostream *)
                        pstack::Procman::operator<<(poVar10,(WaitStatus)execName.field_2._8_4_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            }
            if (execName.field_2._M_local_buf[8] != '\x7f') goto LAB_00107b16;
            fflush(__stream);
            fseek(__stream,0,0);
            pcVar12 = fgets(auStack_26e8,0x1000,__stream);
            if (pcVar12 == (char *)0x0) {
              uVar16 = 0xffffffffffffffff;
            }
            else {
              uVar18 = 0xffffffffffffffff;
              uVar17 = 0xffffffffffffffff;
              uVar15 = 0xffffffffffffffff;
              local_50 = this_00;
              do {
                if (auStack_26e8 == (undefined1  [8])0x93a746743676953) {
                  uVar18 = strtoull(line,(char **)0x0,0x10);
                }
                else if (auStack_26e8 == (undefined1  [8])0x93a6e6749676953) {
                  uVar17 = strtoull(line,(char **)0x0,0x10);
                }
                else if (auStack_26e8 == (undefined1  [8])0x93a6b6c42676953) {
                  uVar15 = strtoull(line,(char **)0x0,0x10);
                }
                pcVar12 = fgets(auStack_26e8,0x1000,__stream);
              } while (pcVar12 != (char *)0x0);
              uVar16 = uVar15 | uVar17 | uVar18 | 0x10;
              this_00 = local_50;
            }
            uVar14 = (uint)execName.field_2._8_4_ >> 8 & 0xff;
            uVar3 = uVar14;
            if (uVar14 == 5) {
              uVar3 = 0;
            }
            uVar19 = (ulong)uVar3;
            if (uVar14 == 0x13) {
              uVar19 = 0;
            }
            if ((uVar16 & (long)(1 << ((char)((ulong)execName.field_2._8_8_ >> 8) - 1U & 0x1f))) ==
                0) {
              local_178._M_pod_data[0] = 1;
              local_88._0_8_ = (Process *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<pstack::Procman::LiveProcess,std::allocator<pstack::Procman::LiveProcess>,pstack::Context&,std::shared_ptr<pstack::Elf::Object>&,int&,bool>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),
                         (LiveProcess **)local_88,
                         (allocator<pstack::Procman::LiveProcess> *)&local_1b8,
                         (Context *)&flags.longVal,(shared_ptr<pstack::Elf::Object> *)&local_a8,
                         (int *)auStack_118,(bool *)local_178._M_pod_data);
              uVar6 = local_88._0_8_;
              local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
              local_88._0_8_ = (int *)0x0;
              local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
              }
              this_00 = local_50;
              pstack::Procman::Process::load();
              anon_unknown.dwarf_1567e::pstack((Process *)uVar6);
              __request = PTRACE_KILL;
            }
            else {
              __request = PTRACE_CONT;
            }
            lVar9 = ptrace(__request,(ulong)(uint)auStack_118._0_4_,0,uVar19);
            if ((int)lVar9 != 0) {
              if ((int)lVar9 == -1) {
                _Var4 = getpid();
                poVar10 = (ostream *)std::ostream::operator<<(local_360,_Var4);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," ptrace failed to kill/continue - ",0x22);
                local_50 = this_00;
                piVar11 = __errno_location();
                pcVar12 = strerror(*piVar11);
                if (pcVar12 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
                }
                else {
                  sVar13 = strlen(pcVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              }
              __assert_fail("rc == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/pstack.cc"
                            ,0x8a,
                            "int (anonymous namespace)::startChild(Context &, Elf::Object::sptr, const std::string &)"
                           );
            }
            if (2 < local_338) {
              _Var4 = getpid();
              poVar10 = (ostream *)std::ostream::operator<<(local_360,_Var4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"..done\n",7);
            }
          }
          if (2 < local_338) {
            _Var4 = getpid();
            poVar10 = (ostream *)std::ostream::operator<<(local_360,_Var4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"... wait failed: ",0x11);
            piVar11 = __errno_location();
            pcVar12 = strerror(*piVar11);
            if (pcVar12 == (char *)0x0) {
              std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
            }
            else {
              sVar13 = strlen(pcVar12);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar12,sVar13);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          }
LAB_00107b16:
          fclose(__stream);
          this = p_Stack_40;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&subprocessCmd.field_2 + 8));
      iVar2 = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
    }
  }
  if ((size_type *)flags.data._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      &flags.shortOptions._M_string_length) {
    operator_delete((void *)flags.data._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    CONCAT71(flags.shortOptions._M_string_length._1_7_,
                             (undefined1)flags.shortOptions._M_string_length) + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_pstack::Flags::Data>,_std::_Select1st<std::pair<const_int,_pstack::Flags::Data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_pstack::Flags::Data>,_std::_Select1st<std::pair<const_int,_pstack::Flags::Data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
               *)&flags.longOptions.super__Vector_base<option,_std::allocator<option>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  if (auStack_448 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_448,
                    (long)flags.longOptions.super__Vector_base<option,_std::allocator<option>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_448);
  }
  if ((size_type *)sleepTime != &subprocessCmd._M_string_length) {
    operator_delete((void *)sleepTime,
                    CONCAT71(subprocessCmd._M_string_length._1_7_,
                             (undefined1)subprocessCmd._M_string_length) + 1);
  }
  if (local_158 != (undefined1  [8])&execName._M_string_length) {
    operator_delete((void *)local_158,
                    CONCAT71(execName._M_string_length._1_7_,(undefined1)execName._M_string_length)
                    + 1);
  }
  statusBuf[0xff8] = std::ofstream::VTT;
  statusBuf[0xff9] = std::ofstream::VTT_1;
  statusBuf[0xffa] = uRam00000000001120d2;
  statusBuf[0xffb] = uRam00000000001120d3;
  statusBuf[0xffc] = uRam00000000001120d4;
  statusBuf[0xffd] = uRam00000000001120d5;
  statusBuf[0xffe] = uRam00000000001120d6;
  statusBuf[0xfff] = uRam00000000001120d7;
  *(undefined8 *)(statusBuf + *(long *)(_VTT + -0x18) + 0xff8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&out);
  std::ios_base::~ios_base(local_550);
  if ((anonymous_namespace)::freeres != '\0') {
    pstack::Context::~Context((Context *)&flags.longVal);
    return iVar2;
  }
  exit(iVar2);
}

Assistant:

int
main(int argc, char **argv)
{
    try {
        Context context;
        struct sigaction sa;
        memset(&sa, 0, sizeof sa);
        sa.sa_handler = [](int) { interrupted = true; };
        // Only interrupt cleanly once. Then just terminate, in case we're stuck in a loop
        sa.sa_flags = SA_RESETHAND;
        sigaction(SIGINT, &sa, nullptr);
        int rc = emain(argc, argv, context);

        // Normally, exit without free'ing imagecache - don't waste effort
        // moving pointers around in a terminating process
        if (!freeres)
           exit(rc);
        return rc;
    }
    catch (std::exception &ex) {
        std::clog << "error: " << ex.what() << std::endl;
        return EX_SOFTWARE;
    }
}